

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawTranslateHandles(XFormWidget *this)

{
  const_reference pvVar1;
  const_reference pvVar2;
  Vector3D *in_RDI;
  double dVar3;
  Vector3D p1;
  Vector3D p0;
  double theta2;
  double theta1;
  int j;
  Vector3D e1;
  Vector3D e0;
  Vector3D b_1;
  Vector3D a;
  int i_1;
  Vector3D b;
  int i;
  double r;
  Vector3D c;
  int startAxis;
  int nSides;
  double arrowSize;
  byte local_241;
  Vector3D *in_stack_fffffffffffffdc8;
  undefined1 local_1e0 [24];
  double local_1c8;
  double local_1a8;
  undefined1 local_170 [24];
  double local_158;
  double local_150;
  int local_144;
  double local_140;
  double local_120;
  double local_100;
  undefined1 local_e0 [48];
  undefined1 local_b0 [28];
  int local_94;
  double local_90;
  undefined1 local_70 [28];
  int local_54;
  XFormWidget *in_stack_ffffffffffffffc0;
  Vector3D local_30;
  int local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x3fc3333333333333;
  local_14 = 8;
  if (in_RDI[10].x != 0.0) {
    local_241 = 0;
    if (((ulong)in_RDI[0x13].y & 0x1000000) != 0) {
      local_241 = *(byte *)((long)&in_RDI[0x13].y + 1) ^ 0xff;
    }
    local_18 = 0;
    if ((local_241 & 1) != 0) {
      local_18 = 2;
    }
    Vector3D::Vector3D(&local_30,(Vector3D *)&in_RDI[0x12].y);
    Vector3D::operator-(in_stack_fffffffffffffdc8,in_RDI);
    dVar3 = Vector3D::norm((Vector3D *)0x214cc1);
    dVar3 = dVar3 / 2.0;
    glLineWidth(0x41000000);
    glBegin(1);
    for (local_54 = local_18; local_54 < 3; local_54 = local_54 + 1) {
      local_90 = dVar3 * 0.85;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&in_RDI[0xe].y,
                 (long)local_54);
      CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
      Vector3D::operator+(in_stack_fffffffffffffdc8,in_RDI);
      pvVar1 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&in_RDI[0x15].y,(long)local_54);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar1,0);
      glColor4ubv(pvVar2);
      glVertex3dv(&local_30);
      glVertex3dv(local_70);
    }
    glEnd();
    glBegin(4);
    for (local_94 = local_18; local_94 < 3; local_94 = local_94 + 1) {
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&in_RDI[0xe].y,
                 (long)local_94);
      CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
      Vector3D::operator+(in_stack_fffffffffffffdc8,in_RDI);
      local_100 = dVar3 * 0.85;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&in_RDI[0xe].y,
                 (long)local_94);
      CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
      Vector3D::operator+(in_stack_fffffffffffffdc8,in_RDI);
      local_120 = dVar3 * 0.5 * 0.15;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&in_RDI[0xe].y,
                 (long)((local_94 + 1) % 3));
      CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
      local_140 = dVar3 * 0.5 * 0.15;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&in_RDI[0xe].y,
                 (long)((local_94 + 2) % 3));
      CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
      pvVar1 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&in_RDI[0x15].y,(long)local_94);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar1,0);
      glColor4ubv(pvVar2);
      for (local_144 = 0; local_144 < 8; local_144 = local_144 + 1) {
        local_150 = ((double)local_144 * 6.283185307179586) / 8.0;
        local_158 = ((double)(local_144 + 1) * 6.283185307179586) / 8.0;
        local_1a8 = cos(local_150);
        CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
        Vector3D::operator+(in_stack_fffffffffffffdc8,in_RDI);
        local_1c8 = sin(local_150);
        CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
        Vector3D::operator-(in_stack_fffffffffffffdc8,in_RDI);
        cos(local_158);
        CMU462::operator*(&in_stack_fffffffffffffdc8->x,in_RDI);
        Vector3D::operator+(in_stack_fffffffffffffdc8,in_RDI);
        in_stack_fffffffffffffdc8 = (Vector3D *)sin(local_158);
        CMU462::operator*((double *)in_stack_fffffffffffffdc8,in_RDI);
        Vector3D::operator-(in_stack_fffffffffffffdc8,in_RDI);
        glVertex3dv(local_b0);
        glVertex3dv(local_170);
        glVertex3dv(local_1e0);
        glVertex3dv(local_170);
        glVertex3dv(local_e0);
        glVertex3dv(local_1e0);
      }
    }
    glEnd();
    if ((((ulong)in_RDI[0x13].y & 0x1000000) == 0) || (((ulong)in_RDI[0x13].y & 0x100) != 0)) {
      drawCenterHandle(in_stack_ffffffffffffffc0);
    }
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawTranslateHandles() const {
  const double arrowSize = .15;
  const int nSides = 8;

  if (target.object == nullptr) return;

  int startAxis = (transformedMode && !objectMode) ? 2 : 0;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  // Draw arrow stems
  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = startAxis; i < 3; i++) {
    Vector3D b = c + (1. - arrowSize) * r * axes[i];

    glColor4ubv(&axisColors[i][0]);

    glVertex3dv(&c.x);
    glVertex3dv(&b.x);
  }
  glEnd();

  // Draw arrow heads
  glBegin(GL_TRIANGLES);
  for (int i = startAxis; i < 3; i++) {
    Vector3D a = c + r * axes[i];
    Vector3D b = c + (1. - arrowSize) * r * axes[i];
    Vector3D e0 = r * .5 * arrowSize * axes[(i + 1) % 3];
    Vector3D e1 = r * .5 * arrowSize * axes[(i + 2) % 3];

    glColor4ubv(&axisColors[i][0]);

    for (int j = 0; j < nSides; j++) {
      double theta1 = 2. * M_PI * (double)j / (double)nSides;
      double theta2 = 2. * M_PI * (double)(j + 1) / (double)nSides;
      Vector3D p0 = b + cos(theta1) * e0 - sin(theta1) * e1;
      Vector3D p1 = b + cos(theta2) * e0 - sin(theta2) * e1;

      glVertex3dv(&a.x);
      glVertex3dv(&p0.x);
      glVertex3dv(&p1.x);

      glVertex3dv(&p0.x);
      glVertex3dv(&b.x);
      glVertex3dv(&p1.x);
    }
  }
  glEnd();

  if (!transformedMode || objectMode) drawCenterHandle();
  glLineWidth(1.);
}